

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void KINPrintInfo(KINMem kin_mem,int info_code,char *module,char *fname,char *msgfmt,...)

{
  undefined8 uVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  char *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int ret;
  char retstr [30];
  char msg1 [40];
  char msg [256];
  va_list ap;
  undefined1 local_258 [40];
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  uint local_19c;
  char local_198 [32];
  char local_178 [48];
  char local_148 [256];
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  int local_c;
  undefined8 local_8;
  
  if (in_AL != '\0') {
    local_228 = in_XMM0_Qa;
    local_218 = in_XMM1_Qa;
    local_208 = in_XMM2_Qa;
    local_1f8 = in_XMM3_Qa;
    local_1e8 = in_XMM4_Qa;
    local_1d8 = in_XMM5_Qa;
    local_1c8 = in_XMM6_Qa;
    local_1b8 = in_XMM7_Qa;
  }
  local_38 = local_258;
  local_40 = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x28;
  local_230 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_ESI == 1) {
    local_44 = 0x30;
    local_48 = 0x30;
    local_19c = (uint)local_230;
    uVar1 = in_R9;
    switch((uint)local_230) {
    case 0:
      sprintf(local_198,"KIN_SUCCESS");
      uVar1 = local_230;
      break;
    case 2:
      sprintf(local_198,"KIN_STEP_LT_STPTOL");
      uVar1 = local_230;
      break;
    case 0xfffffff1:
      sprintf(local_198,"KIN_REPTD_SYSFUNC_ERR");
      uVar1 = local_230;
      break;
    case 0xfffffff3:
      sprintf(local_198,"KIN_SYSFUNC_FAIL");
      uVar1 = local_230;
      break;
    case 0xfffffff4:
      sprintf(local_198,"KIN_PRECONDSOLVE_FAILURE");
      uVar1 = local_230;
      break;
    case 0xfffffff5:
      sprintf(local_198,"KIN_PRECONDSET_FAILURE");
      uVar1 = local_230;
      break;
    case 0xfffffff7:
      sprintf(local_198,"KIN_LINSOLV_NO_RECOVERY");
      uVar1 = local_230;
      break;
    case 0xfffffff8:
      sprintf(local_198,"KIN_LINESEARCH_BCFAIL");
      uVar1 = local_230;
      break;
    case 0xfffffff9:
      sprintf(local_198,"KIN_MXNEWT_5X_EXCEEDED");
      uVar1 = local_230;
      break;
    case 0xfffffffa:
      sprintf(local_198,"KIN_MAXITER_REACHED");
      uVar1 = local_230;
      break;
    case 0xfffffffb:
      sprintf(local_198,"KIN_LINESEARCH_NONCONV");
      uVar1 = local_230;
    }
    local_230 = uVar1;
    sprintf(local_178,local_28,(ulong)local_19c);
    sprintf(local_148,"%s (%s)",local_178,local_198);
  }
  else {
    vsnprintf(local_148,0x100,in_R8,&local_48);
  }
  return;
}

Assistant:

void KINPrintInfo(SUNDIALS_MAYBE_UNUSED KINMem kin_mem, int info_code,
                  SUNDIALS_MAYBE_UNUSED const char* module,
                  SUNDIALS_MAYBE_UNUSED const char* fname, const char* msgfmt,
                  ...)
{
  va_list ap;
  char msg[256], msg1[40];
  char retstr[30];
  int ret;

  /* Initialize argument processing
   (msgfrmt is the last required argument) */

  va_start(ap, msgfmt);

  if (info_code == PRNT_RETVAL)
  {
    /* If info_code = PRNT_RETVAL, decode the numeric value */

    ret = va_arg(ap, int);

    switch (ret)
    {
    case KIN_SUCCESS: sprintf(retstr, "KIN_SUCCESS"); break;
    case KIN_SYSFUNC_FAIL: sprintf(retstr, "KIN_SYSFUNC_FAIL"); break;
    case KIN_REPTD_SYSFUNC_ERR: sprintf(retstr, "KIN_REPTD_SYSFUNC_ERR"); break;
    case KIN_STEP_LT_STPTOL: sprintf(retstr, "KIN_STEP_LT_STPTOL"); break;
    case KIN_LINESEARCH_NONCONV:
      sprintf(retstr, "KIN_LINESEARCH_NONCONV");
      break;
    case KIN_LINESEARCH_BCFAIL: sprintf(retstr, "KIN_LINESEARCH_BCFAIL"); break;
    case KIN_MAXITER_REACHED: sprintf(retstr, "KIN_MAXITER_REACHED"); break;
    case KIN_MXNEWT_5X_EXCEEDED:
      sprintf(retstr, "KIN_MXNEWT_5X_EXCEEDED");
      break;
    case KIN_LINSOLV_NO_RECOVERY:
      sprintf(retstr, "KIN_LINSOLV_NO_RECOVERY");
      break;
    case KIN_LSETUP_FAIL: sprintf(retstr, "KIN_PRECONDSET_FAILURE"); break;
    case KIN_LSOLVE_FAIL: sprintf(retstr, "KIN_PRECONDSOLVE_FAILURE"); break;
    }

    /* Compose the message */

    sprintf(msg1, msgfmt, ret);
    sprintf(msg, "%s (%s)", msg1, retstr);
  }
  else
  {
    /* Compose the message */

    vsnprintf(msg, sizeof msg, msgfmt, ap);
  }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(KIN_LOGGER, SUN_LOGLEVEL_INFO, "KINSOL", fname, "%s", msg);
#endif

  /* finalize argument processing */

  va_end(ap);

  return;
}